

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall
HEkk::initialiseBound(HEkk *this,SimplexAlgorithm algorithm,HighsInt solve_phase,bool perturb)

{
  char cVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pcVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pcVar8;
  pointer pdVar9;
  pointer piVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  initialiseLpColBound(this);
  initialiseLpRowBound(this);
  (this->info_).bounds_perturbed = false;
  if (algorithm == kPrimal) {
    if (perturb) {
      dVar15 = (this->info_).primal_simplex_bound_perturbation_multiplier;
      if ((dVar15 != 0.0) || (NAN(dVar15))) {
        uVar11 = (this->lp_).num_row_;
        uVar13 = (this->lp_).num_col_ + uVar11;
        pdVar3 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar4 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pcVar5 = (this->basis_).nonbasicFlag_.
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (this->info_).numTotRandomValue_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar7 = (this->info_).workRange_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pcVar8 = (this->basis_).nonbasicMove_.
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar9 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar14 = 0;
        uVar12 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar12 = uVar14;
        }
        for (; uVar12 != uVar14; uVar14 = uVar14 + 1) {
          dVar16 = pdVar3[uVar14];
          dVar17 = pdVar4[uVar14];
          if (pcVar5[uVar14] == '\x01') {
            if ((dVar16 != dVar17) || (NAN(dVar16) || NAN(dVar17))) goto LAB_0032d5fb;
          }
          else {
LAB_0032d5fb:
            dVar18 = pdVar6[uVar14];
            if (dVar16 != -INFINITY) {
              dVar19 = -dVar18 * dVar15 * 5e-07;
              if (-1.0 <= dVar16) {
                if (1.0 <= dVar16) {
                  dVar19 = dVar19 * dVar16;
                }
                dVar16 = dVar16 + dVar19;
              }
              else {
                dVar16 = dVar16 - dVar19 * dVar16;
              }
              pdVar3[uVar14] = dVar16;
            }
            if (dVar17 == INFINITY) {
              dVar18 = pdVar4[uVar14];
              dVar19 = dVar16;
            }
            else {
              dVar18 = dVar18 * dVar15 * 5e-07;
              if (-1.0 <= dVar17) {
                if (1.0 <= dVar17) {
                  dVar18 = dVar18 * dVar17;
                }
                dVar17 = dVar18 + dVar17;
              }
              else {
                dVar17 = dVar17 - dVar18 * dVar17;
              }
              pdVar4[uVar14] = dVar17;
              dVar18 = dVar17;
              dVar19 = pdVar3[uVar14];
            }
            pdVar7[uVar14] = dVar18 - dVar19;
            if ((pcVar5[uVar14] != '\0') &&
               ((cVar1 = pcVar8[uVar14], '\0' < cVar1 || (dVar16 = dVar17, cVar1 < '\0')))) {
              pdVar9[uVar14] = dVar16;
            }
          }
        }
        piVar10 = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar3 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar4 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar6 = (this->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar7 = (this->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar14 = 0;
        uVar12 = (ulong)uVar11;
        if ((int)uVar11 < 1) {
          uVar12 = uVar14;
        }
        for (; uVar12 != uVar14; uVar14 = uVar14 + 1) {
          iVar2 = piVar10[uVar14];
          pdVar6[uVar14] = pdVar3[iVar2];
          pdVar7[uVar14] = pdVar4[iVar2];
        }
        (this->info_).bounds_perturbed = true;
      }
    }
  }
  else if (solve_phase != 2) {
    uVar11 = (this->lp_).num_row_ + (this->lp_).num_col_;
    pdVar3 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->info_).workRange_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = 0;
    uVar12 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar12 = uVar14;
    }
    for (; uVar12 != uVar14; uVar14 = uVar14 + 1) {
      dVar15 = pdVar4[uVar14];
      if (-INFINITY < pdVar3[uVar14]) {
        pdVar3[uVar14] = 0.0;
        dVar15 = (double)(-(ulong)(INFINITY <= dVar15) & 0x3ff0000000000000);
      }
      else if (dVar15 < INFINITY) {
        pdVar3[uVar14] = -1.0;
        dVar15 = 0.0;
      }
      else {
        pdVar3[uVar14] = -1000.0;
        dVar15 = 1000.0;
      }
      pdVar4[uVar14] = dVar15;
      pdVar6[uVar14] = dVar15 - pdVar3[uVar14];
    }
  }
  return;
}

Assistant:

void HEkk::initialiseBound(const SimplexAlgorithm algorithm,
                           const HighsInt solve_phase, const bool perturb) {
  initialiseLpColBound();
  initialiseLpRowBound();
  info_.bounds_perturbed = false;
  // Primal simplex bounds are either from the LP or perturbed
  if (algorithm == SimplexAlgorithm::kPrimal) {
    if (!perturb || info_.primal_simplex_bound_perturbation_multiplier == 0)
      return;
    // Perturb the bounds
    // Determine the smallest and largest finite lower/upper bounds
    HighsInt num_col = lp_.num_col_;
    HighsInt num_row = lp_.num_row_;
    HighsInt num_tot = num_col + num_row;
    double min_abs_lower = kHighsInf;
    double max_abs_lower = -1;
    double min_abs_upper = kHighsInf;
    double max_abs_upper = -1;
    for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
      double abs_lower = fabs(info_.workLower_[iVar]);
      double abs_upper = fabs(info_.workUpper_[iVar]);
      if (abs_lower && abs_lower < kHighsInf) {
        min_abs_lower = min(abs_lower, min_abs_lower);
        max_abs_lower = max(abs_lower, max_abs_lower);
      }
      if (abs_upper && abs_upper < kHighsInf) {
        min_abs_upper = min(abs_upper, min_abs_upper);
        max_abs_upper = max(abs_upper, max_abs_upper);
      }
    }
    // printf(
    //     "Nonzero finite lower bounds in [%9.4g, %9.4g]; upper bounds in "
    //     "[%9.4g, %9.4g]\n",
    //     min_abs_lower, max_abs_lower, min_abs_upper, max_abs_upper);

    const double base =
        info_.primal_simplex_bound_perturbation_multiplier * 5e-7;
    for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
      double lower = info_.workLower_[iVar];
      double upper = info_.workUpper_[iVar];
      const bool fixed = lower == upper;
      // Don't perturb bounds of nonbasic fixed variables as they stay nonbasic
      if (basis_.nonbasicFlag_[iVar] == kNonbasicFlagTrue && fixed) continue;
      double random_value = info_.numTotRandomValue_[iVar];
      if (lower > -kHighsInf) {
        if (lower < -1) {
          lower -= random_value * base * (-lower);
        } else if (lower < 1) {
          lower -= random_value * base;
        } else {
          lower -= random_value * base * lower;
        }
        info_.workLower_[iVar] = lower;
      }
      if (upper < kHighsInf) {
        if (upper < -1) {
          upper += random_value * base * (-upper);
        } else if (upper < 1) {
          upper += random_value * base;
        } else {
          upper += random_value * base * upper;
        }
        info_.workUpper_[iVar] = upper;
      }
      info_.workRange_[iVar] = info_.workUpper_[iVar] - info_.workLower_[iVar];
      if (basis_.nonbasicFlag_[iVar] == kNonbasicFlagFalse) continue;
      // Set values of nonbasic variables
      if (basis_.nonbasicMove_[iVar] > 0) {
        info_.workValue_[iVar] = lower;
      } else if (basis_.nonbasicMove_[iVar] < 0) {
        info_.workValue_[iVar] = upper;
      }
    }
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      HighsInt iVar = basis_.basicIndex_[iRow];
      info_.baseLower_[iRow] = info_.workLower_[iVar];
      info_.baseUpper_[iRow] = info_.workUpper_[iVar];
    }
    info_.bounds_perturbed = true;
    return;
  }
  // Dual simplex bounds are either from the LP or set to special values in
  // phase
  // 1
  assert(algorithm == SimplexAlgorithm::kDual);
  if (solve_phase == kSolvePhase2) return;

  // The dual objective is the sum of products of primal and dual
  // values for nonbasic variables. For dual simplex phase 1, the
  // primal bounds are set so that when the dual value is feasible, the
  // primal value is set to zero. Otherwise the value is +1/-1
  // according to the required sign of the dual, except for free
  // variables, where the bounds are [-1000, 1000]. Hence the dual
  // objective is the negation of the sum of infeasibilities, unless there are
  // free In Phase 1: change to dual phase 1 bound.
  const double inf = kHighsInf;
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
    if (info_.workLower_[iCol] == -inf && info_.workUpper_[iCol] == inf) {
      // Phase 1 bounds were not modified for free rows in hsol. Why?
      // To reduce the number of free variables on the assumption that
      // free rows should never be nonbasic? This is normally true
      // when starting from a logical basis or crash - unless
      // singularity makes a free logical nonbasic - but what about an
      // advanced basis start? It doesn't happen with the HiGHS MIP
      // solver. However, SCIP cut handling can lead to a nonbasic row
      // with nonzero dual being made free and, particularly if it's
      // (then) the only dual infeasibility, phase 1 fails to remove
      // it.
      //
      // if (iCol >= lp_.num_col_) continue;
      info_.workLower_[iCol] = -1000,
      info_.workUpper_[iCol] = 1000;  // FREE
    } else if (info_.workLower_[iCol] == -inf) {
      info_.workLower_[iCol] = -1,
      info_.workUpper_[iCol] = 0;  // UPPER
    } else if (info_.workUpper_[iCol] == inf) {
      info_.workLower_[iCol] = 0,
      info_.workUpper_[iCol] = 1;  // LOWER
    } else {
      info_.workLower_[iCol] = 0,
      info_.workUpper_[iCol] = 0;  // BOXED or FIXED
    }
    info_.workRange_[iCol] = info_.workUpper_[iCol] - info_.workLower_[iCol];
  }
}